

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array-test.c++
# Opt level: O2

void __thiscall kj::anon_unknown_0::TestCase399::run(TestCase399 *this)

{
  Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *pOVar1;
  DestructionOrderRecorder *pDVar2;
  _func_int **pp_Var3;
  _func_int **pp_Var4;
  size_t size;
  kj *in_RSI;
  DestructionOrderRecorder *ptrCopy;
  size_t sizeCopy;
  _func_int **pp_Var5;
  uint destroyed3;
  uint destroyed2;
  uint destroyed1;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> arr;
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> local_78;
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> combined;
  uint counter;
  
  counter = 0;
  destroyed1 = 0;
  destroyed2 = 0;
  destroyed3 = 0;
  pDVar2 = (DestructionOrderRecorder *)operator_new(0x10);
  pDVar2->counter = &counter;
  pDVar2->recordTo = &destroyed1;
  pp_Var3 = (_func_int **)operator_new(0x10);
  *pp_Var3 = (_func_int *)&counter;
  pp_Var3[1] = (_func_int *)&destroyed2;
  pp_Var4 = (_func_int **)operator_new(0x10);
  *pp_Var4 = (_func_int *)&counter;
  pp_Var4[1] = (_func_int *)&destroyed3;
  heapArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>>
            (&local_78,in_RSI,size);
  pOVar1 = local_78.ptr;
  (local_78.pos)->disposer =
       (Disposer *)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance;
  (local_78.pos)->ptr = pDVar2;
  pp_Var5 = (_func_int **)((long)local_78.pos + (0x10 - (long)local_78.ptr) >> 4);
  arr.ptr = local_78.ptr;
  arr.disposer = local_78.disposer;
  local_78.ptr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0;
  local_78.pos = (RemoveConst<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_> *)0x0;
  local_78.endPtr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0;
  arr.size_ = (size_t)pp_Var5;
  combined.disposer = (ArrayDisposer *)operator_new(0x40);
  combined.disposer[1]._vptr_ArrayDisposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance
  ;
  combined.disposer[2]._vptr_ArrayDisposer = pp_Var4;
  combined.disposer[3]._vptr_ArrayDisposer =
       (_func_int **)&_::HeapDisposer<kj::(anonymous_namespace)::DestructionOrderRecorder>::instance
  ;
  combined.disposer[4]._vptr_ArrayDisposer = pp_Var3;
  combined.disposer[5]._vptr_ArrayDisposer = (_func_int **)pOVar1;
  combined.disposer[6]._vptr_ArrayDisposer = pp_Var5;
  combined.disposer[7]._vptr_ArrayDisposer = (_func_int **)local_78.disposer;
  arr.ptr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0;
  arr.size_ = 0;
  (combined.disposer)->_vptr_ArrayDisposer = (_func_int **)&PTR_disposeImpl_001c5d48;
  combined.ptr = (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x1;
  if (pOVar1 != (Own<kj::(anonymous_namespace)::DestructionOrderRecorder> *)0x0) {
    combined.ptr = pOVar1;
  }
  combined.size_ = (size_t)pp_Var5;
  if (combined.ptr != pOVar1 && _::Debug::minSeverity < 3) {
    _::Debug::log<char_const(&)[41]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a0,ERROR,"\"failed: expected \" \"combined.begin() == ptr\"",
               (char (*) [41])"failed: expected combined.begin() == ptr");
  }
  if (_::Debug::minSeverity < 3 && destroyed1 != 0) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a5,ERROR,"\"failed: expected \" \"destroyed1 == 0\"",
               (char (*) [33])"failed: expected destroyed1 == 0");
  }
  if (_::Debug::minSeverity < 3 && destroyed2 != 0) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a6,ERROR,"\"failed: expected \" \"destroyed2 == 0\"",
               (char (*) [33])"failed: expected destroyed2 == 0");
  }
  if ((destroyed3 != 0) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1a7,ERROR,"\"failed: expected \" \"destroyed3 == 0\"",
               (char (*) [33])"failed: expected destroyed3 == 0");
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::dispose(&combined);
  if (_::Debug::minSeverity < 3 && destroyed1 != 1) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ab,ERROR,"\"failed: expected \" \"destroyed1 == 1\", destroyed1",
               (char (*) [33])"failed: expected destroyed1 == 1",&destroyed1);
  }
  if (_::Debug::minSeverity < 3 && destroyed2 != 2) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ac,ERROR,"\"failed: expected \" \"destroyed2 == 2\", destroyed2",
               (char (*) [33])"failed: expected destroyed2 == 2",&destroyed2);
  }
  if ((destroyed3 != 3) && (_::Debug::minSeverity < 3)) {
    _::Debug::log<char_const(&)[33],unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/array-test.c++"
               ,0x1ad,ERROR,"\"failed: expected \" \"destroyed3 == 3\", destroyed3",
               (char (*) [33])"failed: expected destroyed3 == 3",&destroyed3);
  }
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::~Array(&combined);
  Array<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::~Array(&arr);
  ArrayBuilder<kj::Own<kj::(anonymous_namespace)::DestructionOrderRecorder>_>::~ArrayBuilder
            (&local_78);
  return;
}

Assistant:

TEST(Array, Attach) {
  uint counter = 0;
  uint destroyed1 = 0;
  uint destroyed2 = 0;
  uint destroyed3 = 0;

  auto obj1 = kj::heap<DestructionOrderRecorder>(counter, destroyed1);
  auto obj2 = kj::heap<DestructionOrderRecorder>(counter, destroyed2);
  auto obj3 = kj::heap<DestructionOrderRecorder>(counter, destroyed3);

  auto builder = kj::heapArrayBuilder<Own<DestructionOrderRecorder>>(1);
  builder.add(kj::mv(obj1));
  auto arr = builder.finish();
  auto ptr = arr.begin();

  Array<Own<DestructionOrderRecorder>> combined = arr.attach(kj::mv(obj2), kj::mv(obj3));

  KJ_EXPECT(combined.begin() == ptr);

  KJ_EXPECT(obj1.get() == nullptr);
  KJ_EXPECT(obj2.get() == nullptr);
  KJ_EXPECT(obj3.get() == nullptr);
  KJ_EXPECT(destroyed1 == 0);
  KJ_EXPECT(destroyed2 == 0);
  KJ_EXPECT(destroyed3 == 0);

  combined = nullptr;

  KJ_EXPECT(destroyed1 == 1, destroyed1);
  KJ_EXPECT(destroyed2 == 2, destroyed2);
  KJ_EXPECT(destroyed3 == 3, destroyed3);
}